

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_6::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  ~TwoLevelIterator(this);
  operator_delete(this);
  return;
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;